

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

void vkt::wsi::createSwapchainTests(TestCaseGroup *testGroup,Type wsiType)

{
  Function in_R9;
  GroupParameters arg0;
  GroupParameters arg0_00;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"create",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Create VkSwapchain with various parameters",&local_52);
  arg0.function = in_R9;
  arg0._0_8_ = anon_unknown_0::createSwapchainTest;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (testGroup,&local_30,&local_50,(CreateChildrenFunc)(ulong)wsiType,arg0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"simulate_oom",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Simulate OOM using callbacks during swapchain construction",
             &local_52);
  arg0_00.function = in_R9;
  arg0_00._0_8_ = anon_unknown_0::createSwapchainSimulateOOMTest;
  addTestGroup<vkt::wsi::(anonymous_namespace)::GroupParameters>
            (testGroup,&local_30,&local_50,(CreateChildrenFunc)(ulong)wsiType,arg0_00);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"render",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Rendering Tests",&local_52);
  addTestGroup<vk::wsi::Type>
            (testGroup,&local_30,&local_50,anon_unknown_0::populateRenderGroup,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"modify",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Modify VkSwapchain",&local_52);
  addTestGroup<vk::wsi::Type>
            (testGroup,&local_30,&local_50,anon_unknown_0::populateModifyGroup,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"destroy",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Destroy VkSwapchain",&local_52);
  addTestGroup<vk::wsi::Type>
            (testGroup,&local_30,&local_50,anon_unknown_0::populateDestroyGroup,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"get_images",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Get swapchain images",&local_52);
  addTestGroup<vk::wsi::Type>
            (testGroup,&local_30,&local_50,anon_unknown_0::populateGetImagesGroup,wsiType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void createSwapchainTests (tcu::TestCaseGroup* testGroup, vk::wsi::Type wsiType)
{
	addTestGroup(testGroup, "create",			"Create VkSwapchain with various parameters",					populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainTest));
	addTestGroup(testGroup, "simulate_oom",		"Simulate OOM using callbacks during swapchain construction",	populateSwapchainGroup,		GroupParameters(wsiType, createSwapchainSimulateOOMTest));
	addTestGroup(testGroup, "render",			"Rendering Tests",												populateRenderGroup,		wsiType);
	addTestGroup(testGroup, "modify",			"Modify VkSwapchain",											populateModifyGroup,		wsiType);
	addTestGroup(testGroup, "destroy",			"Destroy VkSwapchain",											populateDestroyGroup,		wsiType);
	addTestGroup(testGroup, "get_images",		"Get swapchain images",											populateGetImagesGroup,		wsiType);
}